

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O1

size_t __thiscall
embree::FastAllocator::Block::getUsedBytes(Block *this,AllocationType atype,bool huge_pages)

{
  ulong uVar1;
  size_t bytes;
  bool bVar2;
  ulong uVar3;
  
  bytes = 0;
  do {
    if (atype == ANY_TYPE) {
LAB_00c5eee6:
      uVar1 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      uVar3 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      bytes = bytes + uVar3;
    }
    else {
      if (this->atype == EMBREE_OS_MALLOC) {
        bVar2 = this->huge_pages == huge_pages && atype == EMBREE_OS_MALLOC;
      }
      else {
        bVar2 = this->atype == atype;
      }
      if (bVar2) goto LAB_00c5eee6;
    }
    this = this->next;
    if (this == (Block *)0x0) {
      return bytes;
    }
  } while( true );
}

Assistant:

size_t getUsedBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockUsedBytes();
        }
        return bytes;
      }